

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::ReadBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *rdata,uint nbytes,uchar flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  uchar *puVar6;
  byte local_85;
  uint sendPacketSize;
  uchar *sendPacket;
  int numFlushed;
  allocator<char> local_59;
  string local_58 [35];
  byte local_35;
  uint local_34;
  uchar flags_local;
  quadlet_t *pqStack_30;
  uint nbytes_local;
  quadlet_t *rdata_local;
  nodeaddr_t addr_local;
  EthBasePort *pEStack_18;
  nodeid_t node_local;
  EthBasePort *this_local;
  
  local_85 = 0;
  local_35 = flags;
  local_34 = nbytes;
  pqStack_30 = rdata;
  rdata_local = (quadlet_t *)addr;
  addr_local._6_2_ = node;
  pEStack_18 = this;
  if (node != 0x3f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"ReadBlock",&local_59);
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_58,0);
    local_85 = (byte)iVar2 ^ 0xff;
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_85 & 1) == 0) {
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2f])();
    if (0 < iVar2) {
      poVar5 = std::operator<<((this->super_BasePort).outStr,"ReadBlock: flushed ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
      poVar5 = std::operator<<(poVar5," packets");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar6 = (this->super_BasePort).GenericBuffer;
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
    puVar6 = puVar6 + uVar3;
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    uVar3 = iVar2 + 0x14;
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    (*(this->super_BasePort)._vptr_BasePort[0x31])
              (this,puVar6,(ulong)uVar3,(ulong)addr_local._6_2_,(ulong)local_35);
    make_write_header(this,puVar6,uVar3,local_35);
    uVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_bread_packet(this,(quadlet_t *)(puVar6 + uVar4),addr_local._6_2_,(nodeaddr_t)rdata_local,
                      local_34,(uint)this->fw_tl);
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,(ulong)addr_local._6_2_,puVar6,(ulong)uVar3,
                       (ulong)((local_35 & 0x80) != 0));
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else if ((this->eth_read_callback == (EthCallbackType)0x0) ||
            (bVar1 = (*this->eth_read_callback)
                               (this,(uchar)addr_local._6_2_,(this->super_BasePort).outStr), bVar1))
    {
      this_local._7_1_ =
           ReceiveResponseNode(this,addr_local._6_2_,pqStack_30,local_34,this->fw_tl,(nodeid_t *)0x0
                              );
    }
    else {
      poVar5 = std::operator<<((this->super_BasePort).outStr,
                               "ReadBlock: callback aborting (not reading packet)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::ReadBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *rdata,
                                unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadBlock"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadBlock: flushed " << numFlushed << " packets" << std::endl;

    // Create buffer that is large enough for Firewire packet
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_BREAD_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_bread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, nbytes, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadBlock: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    return ReceiveResponseNode(node, rdata, nbytes, fw_tl);
}